

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvTools.cpp
# Opt level: O2

void glslang::SpirvToolsEliminateDeadOutputStores
               (spv_target_env target_env,vector<unsigned_int,_std::allocator<unsigned_int>_> *spirv
               ,unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                *live_locs,
               unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
               *live_builtins,SpvBuildLogger *param_5)

{
  uint32_t *original_binary;
  spv_optimizer_options options;
  PassToken local_60;
  Optimizer optimizer;
  MessageConsumer local_50;
  
  spvtools::Optimizer::Optimizer(&optimizer,target_env);
  local_50.super__Function_base._M_functor._8_8_ = 0;
  local_50.super__Function_base._M_functor._M_unused._M_object = OptimizerMesssageConsumer;
  local_50._M_invoker =
       std::
       _Function_handler<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*),_void_(*)(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>
       ::_M_invoke;
  local_50.super__Function_base._M_manager =
       std::
       _Function_handler<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*),_void_(*)(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>
       ::_M_manager;
  spvtools::Optimizer::SetMessageConsumer(&optimizer,&local_50);
  if (local_50.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_50.super__Function_base._M_manager)
              ((_Any_data *)&local_50,(_Any_data *)&local_50,__destroy_functor);
  }
  spvtools::CreateEliminateDeadOutputStoresPass((spvtools *)&local_60,live_locs,live_builtins);
  spvtools::Optimizer::RegisterPass(&optimizer,&local_60);
  spvtools::Optimizer::PassToken::~PassToken(&local_60);
  spvtools::CreateAggressiveDCEPass((spvtools *)&local_60,false,true);
  spvtools::Optimizer::RegisterPass(&optimizer,&local_60);
  spvtools::Optimizer::PassToken::~PassToken(&local_60);
  spvtools::CreateEliminateDeadOutputComponentsPass();
  spvtools::Optimizer::RegisterPass(&optimizer,&local_60);
  spvtools::Optimizer::PassToken::~PassToken(&local_60);
  spvtools::CreateAggressiveDCEPass((spvtools *)&local_60,false,true);
  spvtools::Optimizer::RegisterPass(&optimizer,&local_60);
  spvtools::Optimizer::PassToken::~PassToken(&local_60);
  options = spvOptimizerOptionsCreate();
  spvtools::Optimizer::SetTargetEnv(&optimizer,target_env);
  spvOptimizerOptionsSetRunValidator(options,false);
  original_binary =
       (spirv->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_start;
  spvtools::Optimizer::Run
            (&optimizer,original_binary,
             (long)(spirv->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)original_binary >> 2,spirv,options);
  spvOptimizerOptionsDestroy(options);
  spvtools::Optimizer::~Optimizer(&optimizer);
  return;
}

Assistant:

void SpirvToolsEliminateDeadOutputStores(spv_target_env target_env, std::vector<unsigned int>& spirv,
                                         std::unordered_set<uint32_t>* live_locs,
                                         std::unordered_set<uint32_t>* live_builtins,
                                         spv::SpvBuildLogger*)
{
  spvtools::Optimizer optimizer(target_env);
  optimizer.SetMessageConsumer(OptimizerMesssageConsumer);

  optimizer.RegisterPass(spvtools::CreateEliminateDeadOutputStoresPass(live_locs, live_builtins));
  optimizer.RegisterPass(spvtools::CreateAggressiveDCEPass(false, true));
  optimizer.RegisterPass(spvtools::CreateEliminateDeadOutputComponentsPass());
  optimizer.RegisterPass(spvtools::CreateAggressiveDCEPass(false, true));

  spvtools::OptimizerOptions spvOptOptions;
  optimizer.SetTargetEnv(target_env);
  spvOptOptions.set_run_validator(false);
  optimizer.Run(spirv.data(), spirv.size(), &spirv, spvOptOptions);
}